

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_fill_rect(nk_draw_list *list,nk_rect rect,nk_color col,float rounding)

{
  nk_vec2 a;
  nk_vec2 a_00;
  undefined4 in_ESI;
  nk_draw_list *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  float in_stack_0000002c;
  undefined4 in_stack_00000030;
  float in_stack_00000040;
  nk_draw_list *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  nk_color color;
  char cStack_11;
  float local_10;
  float fStack_c;
  float local_8;
  float fStack_4;
  
  color = SUB84((ulong)in_stack_ffffffffffffffb0 >> 0x20,0);
  if ((in_RDI != (nk_draw_list *)0x0) &&
     (cStack_11 = (char)((uint)in_ESI >> 0x18), cStack_11 != '\0')) {
    local_10 = (float)in_XMM0_Qa;
    fStack_c = (float)((ulong)in_XMM0_Qa >> 0x20);
    local_8 = (float)in_XMM1_Qa;
    fStack_4 = (float)((ulong)in_XMM1_Qa >> 0x20);
    if (in_RDI->line_AA == NK_ANTI_ALIASING_ON) {
      nk_vec2(local_10,fStack_c);
      color = SUB84((ulong)in_RDI >> 0x20,0);
      nk_vec2(local_10 + local_8,fStack_c + fStack_4);
      a.y = (float)col;
      a.x = in_stack_00000040;
      nk_draw_list_path_rect_to
                ((nk_draw_list *)CONCAT44(rounding,in_stack_00000030),a,(nk_vec2)list,
                 in_stack_0000002c);
      in_RDI = in_stack_ffffffffffffffa8;
    }
    else {
      nk_vec2(local_10 - 0.5,fStack_c - 0.5);
      nk_vec2(local_10 + local_8,fStack_c + fStack_4);
      a_00.y = (float)col;
      a_00.x = in_stack_00000040;
      nk_draw_list_path_rect_to
                ((nk_draw_list *)CONCAT44(rounding,in_stack_00000030),a_00,(nk_vec2)list,
                 in_stack_0000002c);
    }
    nk_draw_list_path_fill(in_RDI,color);
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_fill_rect(struct nk_draw_list *list, struct nk_rect rect,
struct nk_color col, float rounding)
{
NK_ASSERT(list);
if (!list || !col.a) return;

if (list->line_AA == NK_ANTI_ALIASING_ON) {
nk_draw_list_path_rect_to(list, nk_vec2(rect.x, rect.y),
nk_vec2(rect.x + rect.w, rect.y + rect.h), rounding);
} else {
nk_draw_list_path_rect_to(list, nk_vec2(rect.x-0.5f, rect.y-0.5f),
nk_vec2(rect.x + rect.w, rect.y + rect.h), rounding);
} nk_draw_list_path_fill(list,  col);
}